

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_freeallobjects(lua_State *L)

{
  global_State *pgVar1;
  long lVar2;
  long lVar3;
  
  pgVar1 = L->l_G;
  separatetobefnz(L,1);
  callallpendingfinalizers(L,0);
  pgVar1->currentwhite = '\x03';
  pgVar1->gckind = '\0';
  sweeplist(L,&pgVar1->finobj,0xfffffffffffffffd);
  sweeplist(L,&pgVar1->allgc,0xfffffffffffffffd);
  if (0 < (pgVar1->strt).size) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      sweeplist(L,(GCObject **)((long)(pgVar1->strt).hash + lVar3),0xfffffffffffffffd);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar2 < (pgVar1->strt).size);
  }
  return;
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  int i;
  separatetobefnz(L, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L, 0);
  g->currentwhite = WHITEBITS; /* this "white" makes all objects look dead */
  g->gckind = KGC_NORMAL;
  sweepwholelist(L, &g->finobj);  /* finalizers can create objs. in 'finobj' */
  sweepwholelist(L, &g->allgc);
  for (i = 0; i < g->strt.size; i++)  /* free all string lists */
    sweepwholelist(L, &g->strt.hash[i]);
  lua_assert(g->strt.nuse == 0);
}